

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  float fVar1;
  ImGuiWindow *node_00;
  bool bVar2;
  ImGuiContext *ctx;
  bool bVar3;
  ImGuiDockNode *pIVar4;
  
  ctx = GImGui;
  bVar2 = true;
  if (((node != (ImGuiDockNode *)0x0) &&
      (node_00 = node->VisibleWindow, node_00 != (ImGuiWindow *)0x0)) && ((node_00->Flags & 4) == 0)
     ) {
    pIVar4 = DockNodeGetRootNode((ImGuiDockNode *)node_00);
    if (((pIVar4->OnlyNodeWithWindows != node) || (pIVar4->CentralNode != (ImGuiDockNode *)0x0)) &&
       ((undock_floating_node || ((pIVar4->MergedFlags & 0x400) != 0)))) {
      bVar2 = false;
    }
  }
  fVar1 = (GImGui->IO).MouseDownDuration[0];
  bVar3 = IsMouseDragging(0,(ctx->IO).MouseDragThreshold * 1.7);
  if ((!bVar2) && (bVar3)) {
    DockContextQueueUndockNode(ctx,node);
    return;
  }
  if (((bool)(bVar2 & (fVar1 == 0.0 || bVar3))) && (ctx->MovingWindow != window)) {
    StartMouseMovingWindow(window);
    return;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)   // -V1051 PVS-Studio thinks node should be root_node and is wrong about that.
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
        DockContextQueueUndockNode(&g, node); // Will lead to DockNodeStartMouseMovingWindow() -> StartMouseMovingWindow() being called next frame
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
        StartMouseMovingWindow(window);
}